

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::FillBoundaryCoeff(MLNodeLaplacian *this,MultiFab *sigma,Geometry *geom)

{
  bool bVar1;
  Geometry *in_RDX;
  Periodicity *in_RSI;
  FabArray<amrex::FArrayBox> *in_RDI;
  Periodicity PVar2;
  GpuArray<amrex::LinOpBCType,_3U> GVar3;
  Array4<double> *sfab;
  MFIter mfi;
  MFItInfo mfi_info;
  GpuArray<amrex::LinOpBCType,_3U> hibc;
  GpuArray<amrex::LinOpBCType,_3U> lobc;
  Box *domain;
  LinOpBCType in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  uint in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined1 cross;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  GpuArray<amrex::LinOpBCType,_3U> in_stack_fffffffffffffee0;
  MFIter local_f8;
  MFItInfo local_94;
  LinOpBCType local_80 [3];
  Box *local_6c;
  LinOpBCType local_64;
  LinOpBCType local_60 [3];
  undefined8 local_50;
  LinOpBCType local_48;
  Box *local_40;
  IntVect local_38;
  undefined8 local_24;
  int local_1c;
  Geometry *local_18;
  
  cross = (undefined1)((uint)in_stack_fffffffffffffe64 >> 0x18);
  local_18 = in_RDX;
  PVar2 = Geometry::periodicity
                    ((Geometry *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_38.vect._0_8_ = PVar2.period.vect._0_8_;
  local_24._0_4_ = local_38.vect[0];
  local_24._4_4_ = local_38.vect[1];
  local_38.vect[2] = PVar2.period.vect[2];
  local_1c = local_38.vect[2];
  local_38 = PVar2.period.vect;
  FabArray<amrex::FArrayBox>::FillBoundary<double>(in_RDI,in_RSI,(bool)cross);
  if (in_RDI[3].super_FabArrayBase.n_filled.vect[0] == 0) {
    local_40 = Geometry::Domain(local_18);
    uVar4 = 0;
    GVar3 = MLLinOp::LoBC((MLLinOp *)(ulong)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    local_60[2] = GVar3.arr[2];
    local_48 = local_60[2];
    local_60._0_8_ = GVar3.arr._0_8_;
    local_50._0_4_ = local_60[0];
    local_50._4_4_ = local_60[1];
    local_60 = GVar3.arr;
    local_80 = (LinOpBCType  [3])
               MLLinOp::HiBC((MLLinOp *)CONCAT44(uVar4,in_stack_fffffffffffffe60),
                             in_stack_fffffffffffffe5c);
    local_6c = (Box *)local_80._0_8_;
    local_64 = local_80[2];
    MFItInfo::MFItInfo((MFItInfo *)CONCAT44(uVar4,in_stack_fffffffffffffe60));
    MFItInfo::SetDynamic(&local_94,true);
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (FabArrayBase *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   (MFItInfo *)in_RDI);
    while( true ) {
      bVar1 = MFIter::isValid(&local_f8);
      if (!bVar1) break;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (MFIter *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      MFIter::validbox((MFIter *)CONCAT44(uVar4,in_stack_fffffffffffffe60));
      GVar3.arr[2] = (LinOpBCType)local_50;
      GVar3.arr._0_8_ = in_RDI;
      in_stack_fffffffffffffe50 = local_64;
      mlndlap_fillbc_cc<double>
                ((Box *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (Array4<double> *)CONCAT44(in_stack_fffffffffffffe54,local_64),local_6c,GVar3,
                 in_stack_fffffffffffffee0);
      MFIter::operator++(&local_f8);
    }
    MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  }
  return;
}

Assistant:

void
MLNodeLaplacian::FillBoundaryCoeff (MultiFab& sigma, const Geometry& geom)
{
    BL_PROFILE("MLNodeLaplacian::FillBoundaryCoeff()");

    sigma.FillBoundary(geom.periodicity());

    if (m_coarsening_strategy == CoarseningStrategy::Sigma)
    {
        const Box& domain = geom.Domain();
        const auto lobc = LoBC();
        const auto hibc = HiBC();

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(sigma, mfi_info); mfi.isValid(); ++mfi)
        {
            Array4<Real> const& sfab = sigma.array(mfi);
            mlndlap_fillbc_cc<Real>(mfi.validbox(),sfab,domain,lobc,hibc);
        }
    }
}